

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::TimingCheckArgSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if ((((kind == DelayedTerminalArg) || (kind == EmptyTimingCheckArg)) ||
      (kind == ExpressionTimingCheckArg)) || (kind == TimingCheckEvent)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool TimingCheckArgSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DelayedTerminalArg:
        case SyntaxKind::EmptyTimingCheckArg:
        case SyntaxKind::ExpressionTimingCheckArg:
        case SyntaxKind::TimingCheckEvent:
            return true;
        default:
            return false;
    }
}